

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

void __thiscall sf::RenderTarget::applyBlendMode(RenderTarget *this,BlendMode *mode)

{
  Factor FVar1;
  Equation EVar2;
  _func_void_GLenum *p_Var3;
  _func_void_GLenum_GLenum_GLenum_GLenum *p_Var4;
  _func_void_GLenum_GLenum *p_Var5;
  Uint32 UVar6;
  Uint32 UVar7;
  Uint32 UVar8;
  Uint32 UVar9;
  ostream *poVar10;
  BlendMode *mode_local;
  RenderTarget *this_local;
  
  p_Var4 = sf_ptrc_glBlendFuncSeparateEXT;
  if (sfogl_ext_EXT_blend_func_separate == 0) {
    UVar6 = anon_unknown.dwarf_c483c::factorToGlConstant(mode->colorSrcFactor);
    UVar7 = anon_unknown.dwarf_c483c::factorToGlConstant(mode->colorDstFactor);
    glBlendFunc(UVar6,UVar7);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                       ,0x24e,
                       "glBlendFunc( factorToGlConstant(mode.colorSrcFactor), factorToGlConstant(mode.colorDstFactor))"
                      );
  }
  else {
    UVar6 = anon_unknown.dwarf_c483c::factorToGlConstant(mode->colorSrcFactor);
    UVar7 = anon_unknown.dwarf_c483c::factorToGlConstant(mode->colorDstFactor);
    UVar8 = anon_unknown.dwarf_c483c::factorToGlConstant(mode->alphaSrcFactor);
    UVar9 = anon_unknown.dwarf_c483c::factorToGlConstant(mode->alphaDstFactor);
    (*p_Var4)(UVar6,UVar7,UVar8,UVar9);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                       ,0x248,
                       "GLEXT_glBlendFuncSeparate( factorToGlConstant(mode.colorSrcFactor), factorToGlConstant(mode.colorDstFactor), factorToGlConstant(mode.alphaSrcFactor), factorToGlConstant(mode.alphaDstFactor))"
                      );
  }
  p_Var5 = sf_ptrc_glBlendEquationSeparateEXT;
  p_Var3 = sf_ptrc_glBlendEquationEXT;
  if ((sfogl_ext_EXT_blend_minmax == 0) || (sfogl_ext_EXT_blend_subtract == 0)) {
    if (((mode->colorEquation != Add) || (mode->alphaEquation != Add)) &&
       ((applyBlendMode::warned & 1U) == 0)) {
      poVar10 = err();
      poVar10 = std::operator<<(poVar10,
                                "OpenGL extension EXT_blend_minmax and/or EXT_blend_subtract unavailable"
                               );
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      poVar10 = err();
      poVar10 = std::operator<<(poVar10,"Selecting a blend equation not possible");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      poVar10 = err();
      poVar10 = std::operator<<(poVar10,"Ensure that hardware acceleration is enabled if available")
      ;
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      applyBlendMode::warned = true;
    }
  }
  else if (sfogl_ext_EXT_blend_equation_separate == 0) {
    UVar6 = anon_unknown.dwarf_c483c::equationToGlConstant(mode->colorEquation);
    (*p_Var3)(UVar6);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                       ,0x25b,"GLEXT_glBlendEquation(equationToGlConstant(mode.colorEquation))");
  }
  else {
    UVar6 = anon_unknown.dwarf_c483c::equationToGlConstant(mode->colorEquation);
    UVar7 = anon_unknown.dwarf_c483c::equationToGlConstant(mode->alphaEquation);
    (*p_Var5)(UVar6,UVar7);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                       ,599,
                       "GLEXT_glBlendEquationSeparate( equationToGlConstant(mode.colorEquation), equationToGlConstant(mode.alphaEquation))"
                      );
  }
  FVar1 = mode->colorDstFactor;
  (this->m_cache).lastBlendMode.colorSrcFactor = mode->colorSrcFactor;
  (this->m_cache).lastBlendMode.colorDstFactor = FVar1;
  FVar1 = mode->alphaSrcFactor;
  (this->m_cache).lastBlendMode.colorEquation = mode->colorEquation;
  (this->m_cache).lastBlendMode.alphaSrcFactor = FVar1;
  EVar2 = mode->alphaEquation;
  (this->m_cache).lastBlendMode.alphaDstFactor = mode->alphaDstFactor;
  (this->m_cache).lastBlendMode.alphaEquation = EVar2;
  return;
}

Assistant:

void RenderTarget::applyBlendMode(const BlendMode& mode)
{
    // Apply the blend mode, falling back to the non-separate versions if necessary
    if (GLEXT_blend_func_separate)
    {
        glCheck(GLEXT_glBlendFuncSeparate(
            factorToGlConstant(mode.colorSrcFactor), factorToGlConstant(mode.colorDstFactor),
            factorToGlConstant(mode.alphaSrcFactor), factorToGlConstant(mode.alphaDstFactor)));
    }
    else
    {
        glCheck(glBlendFunc(
            factorToGlConstant(mode.colorSrcFactor),
            factorToGlConstant(mode.colorDstFactor)));
    }

    if (GLEXT_blend_minmax && GLEXT_blend_subtract)
    {
        if (GLEXT_blend_equation_separate)
        {
            glCheck(GLEXT_glBlendEquationSeparate(
                equationToGlConstant(mode.colorEquation),
                equationToGlConstant(mode.alphaEquation)));
        }
        else
        {
            glCheck(GLEXT_glBlendEquation(equationToGlConstant(mode.colorEquation)));
        }
    }
    else if ((mode.colorEquation != BlendMode::Add) || (mode.alphaEquation != BlendMode::Add))
    {
        static bool warned = false;

        if (!warned)
        {
            err() << "OpenGL extension EXT_blend_minmax and/or EXT_blend_subtract unavailable" << std::endl;
            err() << "Selecting a blend equation not possible" << std::endl;
            err() << "Ensure that hardware acceleration is enabled if available" << std::endl;

            warned = true;
        }
    }

    m_cache.lastBlendMode = mode;
}